

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Header.cpp
# Opt level: O0

void __thiscall KDIS::PDU::LE_Header::LE_Header(LE_Header *this,Header *H,KDataStream *stream)

{
  KDataStream *stream_local;
  Header *H_local;
  LE_Header *this_local;
  
  Header7::Header7(&this->super_Header,H);
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__LE_Header_00501960;
  DATA_TYPE::LE_EntityIdentifier::LE_EntityIdentifier(&this->m_EntID);
  (*(this->super_Header).super_Header6._vptr_Header6[3])(this,stream,1);
  return;
}

Assistant:

LE_Header::LE_Header(const Header &H, KDataStream &stream) noexcept(false) :
    Header( H )
{
    Decode( stream, true );
}